

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

int Ssw_MiterStatus(Aig_Man_t *p,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  iVar4 = p->nTruePos;
  if ((long)iVar4 < 1) {
    uVar6 = 0;
    uVar3 = 0;
    uVar2 = 0;
  }
  else {
    uVar3 = p->vCos->nSize;
    uVar2 = 0;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    if (uVar3 <= iVar4 - 1U) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    lVar5 = 0;
    uVar3 = 0;
    uVar6 = 0;
    do {
      pAVar1 = *(Aig_Obj_t **)((long)p->vCos->pArray[lVar5] + 8);
      if (pAVar1 == (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
        uVar6 = uVar6 + 1;
      }
      else if ((pAVar1 == p->pConst1) ||
              (((p->nRegs == 0 &&
                ((*(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 7) == 2)) ||
               ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
                != 0)))) {
        uVar3 = uVar3 + 1;
      }
      else {
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      lVar5 = lVar5 + 1;
    } while (iVar4 != lVar5);
  }
  if (fVerbose != 0) {
    Abc_Print((int)p,"Miter has %d outputs. ");
    iVar4 = (int)p;
    Abc_Print(iVar4,"Const0 = %d.  ",(ulong)uVar6);
    Abc_Print(iVar4,"NonConst0 = %d.  ",(ulong)uVar3);
    Abc_Print(iVar4,"Undecided = %d.  ",uVar2);
    Abc_Print(iVar4,"\n");
  }
  uVar6 = -(uint)((int)uVar2 != 0) | 1;
  if (uVar3 != 0) {
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_MiterStatus( Aig_Man_t * p, int fVerbose )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
//    if ( p->pData )
//        return 0;
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( p->nRegs == 0 && Aig_ObjIsCi(Aig_Regular(pChild)) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }

    if ( fVerbose )
    {
        Abc_Print( 1, "Miter has %d outputs. ", Saig_ManPoNum(p) );
        Abc_Print( 1, "Const0 = %d.  ", CountConst0 );
        Abc_Print( 1, "NonConst0 = %d.  ", CountNonConst0 );
        Abc_Print( 1, "Undecided = %d.  ", CountUndecided );
        Abc_Print( 1, "\n" );
    }

    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}